

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O1

bool __thiscall
SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Remove
          (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *this,ArenaAllocator *allocator,
          Lifetime **data)

{
  SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *buffer;
  bool bVar1;
  Type *ppLVar2;
  undefined1 local_40 [8];
  EditingIterator iter;
  
  iter.super_Iterator.current = (NodeBase *)0x0;
  local_40 = (undefined1  [8])this;
  iter.super_Iterator.list = this;
  do {
    bVar1 = EditingIterator::Next((EditingIterator *)local_40);
    if (!bVar1) {
      return bVar1;
    }
    ppLVar2 = Iterator::Data((Iterator *)local_40);
    buffer = iter.super_Iterator.list;
  } while (*ppLVar2 != *data);
  EditingIterator::UnlinkCurrentNode((EditingIterator *)local_40);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             buffer,0x10);
  return bVar1;
}

Assistant:

bool Remove(TAllocator * allocator, TData const& data)
    {
        EditingIterator iter(this);
        while (iter.Next())
        {
            if (iter.Data() == data)
            {
                iter.RemoveCurrent(allocator);
                return true;
            }
        }
        return false;
    }